

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar62 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2618;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  puVar13 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar47._4_4_ = fVar57;
  auVar47._0_4_ = fVar57;
  auVar47._8_4_ = fVar57;
  auVar47._12_4_ = fVar57;
  auVar47._16_4_ = fVar57;
  auVar47._20_4_ = fVar57;
  auVar47._24_4_ = fVar57;
  auVar47._28_4_ = fVar57;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar48._4_4_ = fVar58;
  auVar48._0_4_ = fVar58;
  auVar48._8_4_ = fVar58;
  auVar48._12_4_ = fVar58;
  auVar48._16_4_ = fVar58;
  auVar48._20_4_ = fVar58;
  auVar48._24_4_ = fVar58;
  auVar48._28_4_ = fVar58;
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar49._4_4_ = fVar59;
  auVar49._0_4_ = fVar59;
  auVar49._8_4_ = fVar59;
  auVar49._12_4_ = fVar59;
  auVar49._16_4_ = fVar59;
  auVar49._20_4_ = fVar59;
  auVar49._24_4_ = fVar59;
  auVar49._28_4_ = fVar59;
  fVar57 = fVar57 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar26 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar62 = ZEXT3264(auVar26);
  auVar52._0_8_ = CONCAT44(fVar57,fVar57) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar57;
  auVar52._12_4_ = -fVar57;
  auVar52._16_4_ = -fVar57;
  auVar52._20_4_ = -fVar57;
  auVar52._24_4_ = -fVar57;
  auVar52._28_4_ = -fVar57;
  auVar53._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  auVar53._8_4_ = -fVar58;
  auVar53._12_4_ = -fVar58;
  auVar53._16_4_ = -fVar58;
  auVar53._20_4_ = -fVar58;
  auVar53._24_4_ = -fVar58;
  auVar53._28_4_ = -fVar58;
  auVar54._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  auVar54._8_4_ = -fVar59;
  auVar54._12_4_ = -fVar59;
  auVar54._16_4_ = -fVar59;
  auVar54._20_4_ = -fVar59;
  auVar54._24_4_ = -fVar59;
  auVar54._28_4_ = -fVar59;
  iVar24 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar24;
  auVar50._0_4_ = iVar24;
  auVar50._8_4_ = iVar24;
  auVar50._12_4_ = iVar24;
  auVar50._16_4_ = iVar24;
  auVar50._20_4_ = iVar24;
  auVar50._24_4_ = iVar24;
  auVar50._28_4_ = iVar24;
  auVar26 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar55 = ZEXT3264(auVar26);
  auVar56 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    do {
      do {
        if (puVar13 == &local_23a0) {
          return;
        }
        pfVar1 = (float *)(puVar13 + -1);
        puVar13 = puVar13 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar1);
      uVar25 = *puVar13;
      do {
        if ((uVar25 & 8) == 0) {
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar14),auVar52,auVar47);
          auVar12 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar15),auVar53,auVar48);
          auVar26 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar12));
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar16),auVar54,auVar49);
          auVar27 = vpmaxsd_avx2(ZEXT1632(auVar11),auVar50);
          auVar27 = vpmaxsd_avx512vl(auVar26,auVar27);
          in_ZMM20 = ZEXT3264(auVar27);
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar14 ^ 0x20)),auVar52,
                                    auVar47);
          auVar12 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar15 ^ 0x20)),auVar53,
                                    auVar48);
          auVar26 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar12));
          auVar11 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar16 ^ 0x20)),auVar54,
                                    auVar49);
          auVar28 = vpminsd_avx512vl(ZEXT1632(auVar11),auVar62._0_32_);
          auVar26 = vpminsd_avx2(auVar26,auVar28);
          uVar9 = vpcmpd_avx512vl(auVar27,auVar26,2);
          tray = (TravRayK<4,_false> *)CONCAT44((int)((ulong)tray >> 0x20),(uint)(byte)uVar9);
        }
        if ((uVar25 & 8) == 0) {
          if (tray == (TravRayK<4,_false> *)0x0) {
            iVar24 = 4;
          }
          else {
            auVar26 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar25 & 0xfffffffffffffff0));
            auVar27 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar25 & 0xfffffffffffffff0))[1]);
            auVar28 = vmovdqa64_avx512vl(auVar55._0_32_);
            auVar31 = in_ZMM20._0_32_;
            auVar28 = vpternlogd_avx512vl(auVar28,auVar31,auVar56._0_32_,0xf8);
            uVar25 = (ulong)tray & 0xffffffff;
            auVar29 = vpcompressd_avx512vl(auVar28);
            bVar5 = (bool)((byte)uVar25 & 1);
            auVar30._0_4_ = (uint)bVar5 * auVar29._0_4_ | (uint)!bVar5 * auVar28._0_4_;
            bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar30._4_4_ = (uint)bVar5 * auVar29._4_4_ | (uint)!bVar5 * auVar28._4_4_;
            bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar30._8_4_ = (uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * auVar28._8_4_;
            bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar30._12_4_ = (uint)bVar5 * auVar29._12_4_ | (uint)!bVar5 * auVar28._12_4_;
            bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar30._16_4_ = (uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * auVar28._16_4_;
            bVar5 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar30._20_4_ = (uint)bVar5 * auVar29._20_4_ | (uint)!bVar5 * auVar28._20_4_;
            bVar5 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar30._24_4_ = (uint)bVar5 * auVar29._24_4_ | (uint)!bVar5 * auVar28._24_4_;
            bVar5 = (bool)((byte)(uVar25 >> 7) & 1);
            auVar30._28_4_ = (uint)bVar5 * auVar29._28_4_ | (uint)!bVar5 * auVar28._28_4_;
            auVar28 = vmovdqa64_avx512vl(auVar26);
            auVar28 = vpermt2q_avx512vl(auVar28,auVar30,auVar27);
            uVar25 = auVar28._0_8_;
            iVar24 = 0;
            uVar17 = (ulong)((long)&tray[-1].tfar.field_0 + 0xfU) & (ulong)tray;
            if (uVar17 != 0) {
              auVar28 = vpshufd_avx512vl(auVar30,0x55);
              auVar29 = vmovdqa64_avx512vl(auVar26);
              vpermt2q_avx512vl(auVar29,auVar28,auVar27);
              auVar29 = vpminsd_avx512vl(auVar30,auVar28);
              auVar28 = vpmaxsd_avx512vl(auVar30,auVar28);
              uVar17 = uVar17 - 1 & uVar17;
              if (uVar17 == 0) {
                auVar29 = vpermi2q_avx512vl(auVar29,auVar26,auVar27);
                uVar25 = auVar29._0_8_;
                auVar26 = vpermt2q_avx512vl(auVar26,auVar28,auVar27);
                *puVar13 = auVar26._0_8_;
                auVar26 = vpermd_avx512vl(auVar28,auVar31);
                *(int *)(puVar13 + 1) = auVar26._0_4_;
                puVar13 = puVar13 + 2;
              }
              else {
                auVar33 = vpshufd_avx512vl(auVar30,0xaa);
                auVar32 = vmovdqa64_avx512vl(auVar26);
                vpermt2q_avx512vl(auVar32,auVar33,auVar27);
                auVar32 = vpminsd_avx2(auVar29,auVar33);
                auVar29 = vpmaxsd_avx2(auVar29,auVar33);
                auVar33 = vpminsd_avx2(auVar28,auVar29);
                auVar28 = vpmaxsd_avx2(auVar28,auVar29);
                uVar17 = uVar17 - 1 & uVar17;
                if (uVar17 == 0) {
                  auVar29 = vpermi2q_avx512vl(auVar32,auVar26,auVar27);
                  uVar25 = auVar29._0_8_;
                  auVar29 = vmovdqa64_avx512vl(auVar26);
                  auVar29 = vpermt2q_avx512vl(auVar29,auVar28,auVar27);
                  *puVar13 = auVar29._0_8_;
                  auVar28 = vpermd_avx512vl(auVar28,auVar31);
                  *(int *)(puVar13 + 1) = auVar28._0_4_;
                  auVar26 = vpermt2q_avx512vl(auVar26,auVar33,auVar27);
                  puVar13[2] = auVar26._0_8_;
                  auVar26 = vpermd_avx512vl(auVar33,auVar31);
                  *(int *)(puVar13 + 3) = auVar26._0_4_;
                  puVar13 = puVar13 + 4;
                }
                else {
                  auVar29 = vpshufd_avx512vl(auVar30,0xff);
                  auVar34 = vmovdqa64_avx512vl(auVar26);
                  vpermt2q_avx512vl(auVar34,auVar29,auVar27);
                  auVar34 = vpminsd_avx512vl(auVar32,auVar29);
                  auVar29 = vpmaxsd_avx2(auVar32,auVar29);
                  auVar32 = vpminsd_avx2(auVar33,auVar29);
                  auVar29 = vpmaxsd_avx2(auVar33,auVar29);
                  auVar33 = vpminsd_avx2(auVar28,auVar29);
                  auVar28 = vpmaxsd_avx2(auVar28,auVar29);
                  uVar17 = uVar17 - 1 & uVar17;
                  iVar24 = 0;
                  if (uVar17 == 0) {
                    auVar29 = vpermi2q_avx512vl(auVar34,auVar26,auVar27);
                    uVar25 = auVar29._0_8_;
                    auVar29 = vmovdqa64_avx512vl(auVar26);
                    auVar29 = vpermt2q_avx512vl(auVar29,auVar28,auVar27);
                    *puVar13 = auVar29._0_8_;
                    auVar28 = vpermd_avx512vl(auVar28,auVar31);
                    *(int *)(puVar13 + 1) = auVar28._0_4_;
                    auVar28 = vmovdqa64_avx512vl(auVar26);
                    auVar28 = vpermt2q_avx512vl(auVar28,auVar33,auVar27);
                    puVar13[2] = auVar28._0_8_;
                    auVar28 = vpermd_avx512vl(auVar33,auVar31);
                    *(int *)(puVar13 + 3) = auVar28._0_4_;
                    auVar26 = vpermt2q_avx512vl(auVar26,auVar32,auVar27);
                    puVar13[4] = auVar26._0_8_;
                    auVar26 = vpermd_avx512vl(auVar32,auVar31);
                    *(int *)(puVar13 + 5) = auVar26._0_4_;
                    puVar13 = puVar13 + 6;
                  }
                  else {
                    auVar35 = valignd_avx512vl(auVar30,auVar30,3);
                    auVar29 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar30 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar29,auVar34);
                    auVar29 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar30 = vpermt2d_avx512vl(auVar30,auVar29,auVar32);
                    auVar30 = vpermt2d_avx512vl(auVar30,auVar29,auVar33);
                    auVar29 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar28 = vpermt2d_avx512vl(auVar30,auVar29,auVar28);
                    auVar61 = ZEXT3264(auVar28);
                    local_2618 = uVar17;
                    do {
                      auVar30 = auVar61._0_32_;
                      auVar28._8_4_ = 1;
                      auVar28._0_8_ = 0x100000001;
                      auVar28._12_4_ = 1;
                      auVar28._16_4_ = 1;
                      auVar28._20_4_ = 1;
                      auVar28._24_4_ = 1;
                      auVar28._28_4_ = 1;
                      auVar28 = vpermd_avx2(auVar28,auVar35);
                      auVar35 = valignd_avx512vl(auVar35,auVar35,1);
                      auVar29 = vmovdqa64_avx512vl(auVar26);
                      vpermt2q_avx512vl(auVar29,auVar35,auVar27);
                      local_2618 = local_2618 - 1 & local_2618;
                      uVar9 = vpcmpd_avx512vl(auVar28,auVar30,5);
                      auVar28 = vpmaxsd_avx2(auVar28,auVar30);
                      bVar10 = (byte)uVar9 << 1;
                      auVar29 = valignd_avx512vl(auVar30,auVar30,7);
                      bVar5 = (bool)((byte)uVar9 & 1);
                      auVar32._4_4_ = (uint)bVar5 * auVar29._4_4_ | (uint)!bVar5 * auVar28._4_4_;
                      auVar32._0_4_ = auVar28._0_4_;
                      bVar5 = (bool)(bVar10 >> 2 & 1);
                      auVar32._8_4_ = (uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * auVar28._8_4_;
                      bVar5 = (bool)(bVar10 >> 3 & 1);
                      auVar32._12_4_ = (uint)bVar5 * auVar29._12_4_ | (uint)!bVar5 * auVar28._12_4_;
                      bVar5 = (bool)(bVar10 >> 4 & 1);
                      auVar32._16_4_ = (uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * auVar28._16_4_;
                      bVar5 = (bool)(bVar10 >> 5 & 1);
                      auVar32._20_4_ = (uint)bVar5 * auVar29._20_4_ | (uint)!bVar5 * auVar28._20_4_;
                      bVar5 = (bool)(bVar10 >> 6 & 1);
                      auVar32._24_4_ = (uint)bVar5 * auVar29._24_4_ | (uint)!bVar5 * auVar28._24_4_;
                      auVar32._28_4_ =
                           (uint)(bVar10 >> 7) * auVar29._28_4_ |
                           (uint)!(bool)(bVar10 >> 7) * auVar28._28_4_;
                      auVar61 = ZEXT3264(auVar32);
                    } while (local_2618 != 0);
                    lVar18 = POPCOUNT(uVar17) + 3;
                    do {
                      auVar28 = vpermi2q_avx512vl(auVar32,auVar26,auVar27);
                      *puVar13 = auVar28._0_8_;
                      auVar29 = auVar61._0_32_;
                      auVar28 = vpermd_avx512vl(auVar29,auVar31);
                      *(int *)(puVar13 + 1) = auVar28._0_4_;
                      auVar32 = valignd_avx512vl(auVar29,auVar29,1);
                      puVar13 = puVar13 + 2;
                      auVar61 = ZEXT3264(auVar32);
                      lVar18 = lVar18 + -1;
                    } while (lVar18 != 0);
                    auVar26 = vpermt2q_avx512vl(auVar26,auVar32,auVar27);
                    uVar25 = auVar26._0_8_;
                  }
                }
              }
            }
          }
        }
        else {
          iVar24 = 6;
        }
      } while (iVar24 == 0);
    } while (iVar24 != 6);
    uVar17 = (ulong)((uint)uVar25 & 0xf);
    if (uVar17 != 8) {
      auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4)));
      auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
      uVar25 = uVar25 & 0xfffffffffffffff0;
      auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      lVar18 = 0;
      do {
        lVar22 = lVar18 * 0xe0;
        lVar2 = uVar25 + 0xd0 + lVar22;
        local_25c0 = *(undefined8 *)(lVar2 + 0x10);
        uStack_25b8 = *(undefined8 *)(lVar2 + 0x18);
        lVar2 = uVar25 + 0xc0 + lVar22;
        local_25a0 = *(undefined8 *)(lVar2 + 0x10);
        uStack_2598 = *(undefined8 *)(lVar2 + 0x18);
        uStack_2590 = local_25a0;
        uStack_2588 = uStack_2598;
        uStack_25b0 = local_25c0;
        uStack_25a8 = uStack_25b8;
        auVar40._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x60 + lVar22);
        auVar40._0_16_ = *(undefined1 (*) [16])(uVar25 + lVar22);
        auVar41._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x70 + lVar22);
        auVar41._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x10 + lVar22);
        auVar42._16_16_ = *(undefined1 (*) [16])(uVar25 + 0x80 + lVar22);
        auVar42._0_16_ = *(undefined1 (*) [16])(uVar25 + 0x20 + lVar22);
        auVar11 = *(undefined1 (*) [16])(uVar25 + 0x30 + lVar22);
        auVar36._16_16_ = auVar11;
        auVar36._0_16_ = auVar11;
        auVar11 = *(undefined1 (*) [16])(uVar25 + 0x40 + lVar22);
        auVar37._16_16_ = auVar11;
        auVar37._0_16_ = auVar11;
        auVar32 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x14 + lVar22));
        auVar33 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x24 + lVar22));
        auVar34 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x28 + lVar22));
        auVar35 = vbroadcastf32x4_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x2c + lVar22));
        auVar36 = vsubps_avx512vl(auVar40,auVar36);
        auVar37 = vsubps_avx512vl(auVar41,auVar37);
        auVar32 = vsubps_avx512vl(auVar42,auVar32);
        auVar38 = vsubps_avx512vl(auVar33,auVar40);
        auVar39 = vsubps_avx512vl(auVar34,auVar41);
        auVar35 = vsubps_avx512vl(auVar35,auVar42);
        auVar33 = vmulps_avx512vl(auVar37,auVar35);
        local_2500 = vfmsub231ps_avx512vl(auVar33,auVar39,auVar32);
        auVar33 = vmulps_avx512vl(auVar32,auVar38);
        local_24e0 = vfmsub231ps_avx512vl(auVar33,auVar35,auVar36);
        auVar33 = vmulps_avx512vl(auVar36,auVar39);
        local_24c0 = vfmsub231ps_avx512vl(auVar33,auVar38,auVar37);
        auVar40 = vsubps_avx512vl(auVar40,auVar26);
        auVar41 = vsubps_avx512vl(auVar41,auVar27);
        auVar42 = vsubps_avx512vl(auVar42,auVar28);
        auVar33 = vmulps_avx512vl(auVar30,auVar42);
        auVar43 = vfmsub231ps_avx512vl(auVar33,auVar41,auVar31);
        auVar33 = vmulps_avx512vl(auVar31,auVar40);
        auVar44 = vfmsub231ps_avx512vl(auVar33,auVar42,auVar29);
        auVar33 = vmulps_avx512vl(auVar29,auVar41);
        auVar45 = vfmsub231ps_avx512vl(auVar33,auVar40,auVar30);
        auVar33 = vmulps_avx512vl(local_24c0,auVar31);
        auVar33 = vfmadd231ps_avx512vl(auVar33,local_24e0,auVar30);
        local_2520 = vfmadd231ps_avx512vl(auVar33,local_2500,auVar29);
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar33._16_4_ = 0x7fffffff;
        auVar33._20_4_ = 0x7fffffff;
        auVar33._24_4_ = 0x7fffffff;
        auVar33._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2520,auVar33);
        auVar34._8_4_ = 0x80000000;
        auVar34._0_8_ = 0x8000000080000000;
        auVar34._12_4_ = 0x80000000;
        auVar34._16_4_ = 0x80000000;
        auVar34._20_4_ = 0x80000000;
        auVar34._24_4_ = 0x80000000;
        auVar34._28_4_ = 0x80000000;
        vandps_avx512vl(local_2520,auVar34);
        auVar33 = vmulps_avx512vl(auVar35,auVar45);
        auVar11 = vfmadd231ps_fma(auVar33,auVar44,auVar39);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar43,auVar38);
        local_2580._0_4_ = (float)(local_2520._0_4_ ^ auVar11._0_4_);
        local_2580._4_4_ = (float)(local_2520._4_4_ ^ auVar11._4_4_);
        local_2580._8_4_ = (float)(local_2520._8_4_ ^ auVar11._8_4_);
        local_2580._12_4_ = (float)(local_2520._12_4_ ^ auVar11._12_4_);
        fVar57 = local_2520._16_4_;
        local_2580._16_4_ = fVar57;
        fVar58 = local_2520._20_4_;
        local_2580._20_4_ = fVar58;
        fVar59 = local_2520._24_4_;
        local_2580._24_4_ = fVar59;
        fVar60 = local_2520._28_4_;
        local_2580._28_4_ = fVar60;
        auVar32 = vmulps_avx512vl(auVar32,auVar45);
        auVar32 = vfmadd231ps_avx512vl(auVar32,auVar37,auVar44);
        auVar32 = vfmadd231ps_avx512vl(auVar32,auVar36,auVar43);
        local_2560._0_4_ = (float)(local_2520._0_4_ ^ auVar32._0_4_);
        local_2560._4_4_ = (float)(local_2520._4_4_ ^ auVar32._4_4_);
        local_2560._8_4_ = (float)(local_2520._8_4_ ^ auVar32._8_4_);
        local_2560._12_4_ = (float)(local_2520._12_4_ ^ auVar32._12_4_);
        local_2560._16_4_ = (float)((uint)fVar57 ^ auVar32._16_4_);
        local_2560._20_4_ = (float)((uint)fVar58 ^ auVar32._20_4_);
        local_2560._24_4_ = (float)((uint)fVar59 ^ auVar32._24_4_);
        local_2560._28_4_ = (float)((uint)fVar60 ^ auVar32._28_4_);
        uVar9 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
        uVar6 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
        uVar7 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
        auVar35._0_4_ = local_2580._0_4_ + local_2560._0_4_;
        auVar35._4_4_ = local_2580._4_4_ + local_2560._4_4_;
        auVar35._8_4_ = local_2580._8_4_ + local_2560._8_4_;
        auVar35._12_4_ = local_2580._12_4_ + local_2560._12_4_;
        auVar35._16_4_ = fVar57 + local_2560._16_4_;
        auVar35._20_4_ = fVar58 + local_2560._20_4_;
        auVar35._24_4_ = fVar59 + local_2560._24_4_;
        auVar35._28_4_ = fVar60 + local_2560._28_4_;
        uVar8 = vcmpps_avx512vl(auVar35,local_2520,2);
        local_24a0 = (byte)uVar9 & (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
        if (local_24a0 != 0) {
          auVar32 = vmulps_avx512vl(local_24c0,auVar42);
          auVar32 = vfmadd213ps_avx512vl(auVar41,local_24e0,auVar32);
          auVar32 = vfmadd213ps_avx512vl(auVar40,local_2500,auVar32);
          local_2540 = vxorps_avx512vl(local_2520,auVar32);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar38._4_4_ = uVar3;
          auVar38._0_4_ = uVar3;
          auVar38._8_4_ = uVar3;
          auVar38._12_4_ = uVar3;
          auVar38._16_4_ = uVar3;
          auVar38._20_4_ = uVar3;
          auVar38._24_4_ = uVar3;
          auVar38._28_4_ = uVar3;
          auVar32 = vmulps_avx512vl(local_2520,auVar38);
          uVar9 = vcmpps_avx512vl(auVar32,local_2540,1);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar39._4_4_ = uVar3;
          auVar39._0_4_ = uVar3;
          auVar39._8_4_ = uVar3;
          auVar39._12_4_ = uVar3;
          auVar39._16_4_ = uVar3;
          auVar39._20_4_ = uVar3;
          auVar39._24_4_ = uVar3;
          auVar39._28_4_ = uVar3;
          auVar32 = vmulps_avx512vl(local_2520,auVar39);
          uVar6 = vcmpps_avx512vl(local_2540,auVar32,2);
          local_24a0 = (byte)uVar9 & (byte)uVar6 & local_24a0;
          if (local_24a0 != 0) {
            uVar19 = (uint)local_24a0;
            local_23c0 = 0xf0;
            auVar32 = vrcp14ps_avx512vl(local_2520);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = &DAT_3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar45._16_4_ = 0x3f800000;
            auVar45._20_4_ = 0x3f800000;
            auVar45._24_4_ = 0x3f800000;
            auVar45._28_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_avx512vl(local_2520,auVar32,auVar45);
            auVar33 = vfmadd132ps_avx512vl(auVar33,auVar32,auVar32);
            local_2440 = vmulps_avx512vl(auVar33,local_2540);
            auVar32 = vmulps_avx512vl(auVar33,local_2580);
            auVar32 = vminps_avx(auVar32,auVar45);
            auVar33 = vmulps_avx512vl(auVar33,local_2560);
            auVar33 = vminps_avx(auVar33,auVar45);
            auVar34 = vsubps_avx(auVar45,auVar32);
            auVar35 = vsubps_avx(auVar45,auVar33);
            local_2460 = vblendps_avx(auVar33,auVar34,0xf0);
            local_2480 = vblendps_avx(auVar32,auVar35,0xf0);
            local_2420 = vmulps_avx512vl(local_2500,_DAT_02060940);
            local_2400 = vmulps_avx512vl(local_24e0,_DAT_02060940);
            local_23e0 = vmulps_avx512vl(local_24c0,_DAT_02060940);
            auVar44._8_4_ = 0x7f800000;
            auVar44._0_8_ = 0x7f8000007f800000;
            auVar44._12_4_ = 0x7f800000;
            auVar44._16_4_ = 0x7f800000;
            auVar44._20_4_ = 0x7f800000;
            auVar44._24_4_ = 0x7f800000;
            auVar44._28_4_ = 0x7f800000;
            auVar32 = vblendmps_avx512vl(auVar44,local_2440);
            auVar43._0_4_ =
                 (uint)(local_24a0 & 1) * auVar32._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000
            ;
            bVar5 = (bool)(local_24a0 >> 1 & 1);
            auVar43._4_4_ = (uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(local_24a0 >> 2 & 1);
            auVar43._8_4_ = (uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(local_24a0 >> 3 & 1);
            auVar43._12_4_ = (uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(local_24a0 >> 4 & 1);
            auVar43._16_4_ = (uint)bVar5 * auVar32._16_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(local_24a0 >> 5 & 1);
            auVar43._20_4_ = (uint)bVar5 * auVar32._20_4_ | (uint)!bVar5 * 0x7f800000;
            bVar5 = (bool)(local_24a0 >> 6 & 1);
            auVar43._24_4_ = (uint)bVar5 * auVar32._24_4_ | (uint)!bVar5 * 0x7f800000;
            auVar43._28_4_ =
                 (uint)(local_24a0 >> 7) * auVar32._28_4_ |
                 (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
            auVar32 = vshufps_avx(auVar43,auVar43,0xb1);
            auVar32 = vminps_avx(auVar43,auVar32);
            auVar33 = vshufpd_avx(auVar32,auVar32,5);
            auVar32 = vminps_avx(auVar32,auVar33);
            auVar33 = vpermpd_avx2(auVar32,0x4e);
            auVar32 = vminps_avx(auVar32,auVar33);
            uVar9 = vcmpps_avx512vl(auVar43,auVar32,0);
            if (((byte)uVar9 & local_24a0) != 0) {
              local_24a0 = (byte)uVar9 & local_24a0;
            }
            uVar21 = 0;
            for (uVar20 = (uint)local_24a0; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
              uVar21 = uVar21 + 1;
            }
            while( true ) {
              uVar20 = *(uint *)((long)&local_25a0 + (ulong)(uVar21 & 0xff) * 4);
              if ((((context->scene->geometries).items[uVar20].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) break;
              local_2618._0_1_ = (byte)uVar19;
              local_2618._0_1_ = ~(byte)(1 << (uVar21 & 0x1f)) & (byte)local_2618;
              uVar19 = (uint)(byte)local_2618;
              if ((byte)local_2618 == 0) goto LAB_0084a1f4;
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar51._16_4_ = 0x7f800000;
              auVar51._20_4_ = 0x7f800000;
              auVar51._24_4_ = 0x7f800000;
              auVar51._28_4_ = 0x7f800000;
              auVar32 = vblendmps_avx512vl(auVar51,local_2440);
              auVar46._0_4_ =
                   (uint)((byte)local_2618 & 1) * auVar32._0_4_ |
                   (uint)!(bool)((byte)local_2618 & 1) * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 1 & 1);
              auVar46._4_4_ = (uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 2 & 1);
              auVar46._8_4_ = (uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 3 & 1);
              auVar46._12_4_ = (uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 4 & 1);
              auVar46._16_4_ = (uint)bVar5 * auVar32._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 5 & 1);
              auVar46._20_4_ = (uint)bVar5 * auVar32._20_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)((byte)local_2618 >> 6 & 1);
              auVar46._24_4_ = (uint)bVar5 * auVar32._24_4_ | (uint)!bVar5 * 0x7f800000;
              auVar46._28_4_ =
                   (uint)((byte)local_2618 >> 7) * auVar32._28_4_ |
                   (uint)!(bool)((byte)local_2618 >> 7) * 0x7f800000;
              auVar32 = vshufps_avx(auVar46,auVar46,0xb1);
              auVar32 = vminps_avx(auVar46,auVar32);
              auVar33 = vshufpd_avx(auVar32,auVar32,5);
              auVar32 = vminps_avx(auVar32,auVar33);
              auVar33 = vpermpd_avx2(auVar32,0x4e);
              auVar32 = vminps_avx(auVar32,auVar33);
              uVar9 = vcmpps_avx512vl(auVar46,auVar32,0);
              local_2618._0_1_ = (byte)uVar9 & (byte)local_2618;
              uVar20 = uVar19;
              if ((byte)local_2618 != 0) {
                uVar20 = (uint)(byte)local_2618;
              }
              uVar21 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar21 = uVar21 + 1;
              }
            }
            uVar23 = (ulong)((uVar21 & 0xff) << 2);
            uVar3 = *(undefined4 *)(local_2480 + uVar23);
            uVar4 = *(undefined4 *)(local_2460 + uVar23);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar23);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar23);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar23);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar23);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25c0 + uVar23);
            *(uint *)(ray + k * 4 + 0x120) = uVar20;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_0084a1f4:
        lVar18 = lVar18 + 1;
      } while (lVar18 != uVar17 - 8);
    }
    auVar26 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar62 = ZEXT3264(auVar26);
    auVar26 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar55 = ZEXT3264(auVar26);
    auVar56 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }